

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O2

bool cmFortranParser_FilePop(cmFortranParser *parser)

{
  _Elt_pointer pcVar1;
  _Elt_pointer pcVar2;
  YY_BUFFER_STATE b;
  _Elt_pointer pcVar3;
  cmFortranFile f;
  undefined1 local_60 [56];
  
  pcVar1 = (parser->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  pcVar2 = (parser->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pcVar2 != pcVar1) {
    pcVar3 = pcVar2;
    if (pcVar2 == (parser->FileStack).c.
                  super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pcVar3 = (parser->FileStack).c.
               super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 9;
    }
    cmFortranFile::cmFortranFile((cmFortranFile *)local_60,pcVar3 + -1);
    std::deque<cmFortranFile,_std::allocator<cmFortranFile>_>::pop_back(&(parser->FileStack).c);
    fclose((FILE *)local_60._0_8_);
    b = cmFortranLexer_GetCurrentBuffer(parser->Scanner);
    cmFortran_yy_delete_buffer(b,parser->Scanner);
    cmFortran_yy_switch_to_buffer((YY_BUFFER_STATE)local_60._8_8_,parser->Scanner);
    std::__cxx11::string::~string((string *)(local_60 + 0x10));
  }
  return pcVar2 != pcVar1;
}

Assistant:

void cmFortranParser_RuleIfndef(cmFortranParser* parser, const char* macro)
{
  // A new PP branch has been opened
  parser->SkipToEnd.push(false);

  if (parser->InPPFalseBranch) {
    parser->InPPFalseBranch++;
  } else if (parser->PPDefinitions.find(macro) !=
             parser->PPDefinitions.end()) {
    parser->InPPFalseBranch = 1;
  } else {
    // ignore other branches
    parser->SkipToEnd.top() = true;
  }
}